

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscrete.h
# Opt level: O0

Interface_ProblemToPolicyDiscrete * __thiscall
JointPolicyDiscrete::GetInterfacePTPDiscrete(JointPolicyDiscrete *this)

{
  bool bVar1;
  ostream *this_00;
  shared_ptr<const_Interface_ProblemToPolicyDiscrete> *in_RDI;
  element_type *local_8;
  
  bVar1 = boost::operator!=(in_RDI,in_RDI);
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  if (in_RDI[2].px == (element_type *)0x0) {
    local_8 = boost::shared_ptr<const_Interface_ProblemToPolicyDiscrete>::get
                        ((shared_ptr<const_Interface_ProblemToPolicyDiscrete> *)&in_RDI[2].pn);
  }
  else {
    local_8 = in_RDI[2].px;
  }
  return local_8;
}

Assistant:

const Interface_ProblemToPolicyDiscrete* GetInterfacePTPDiscrete() const
        {
            if(_m_PTPDshared!=0)
                std::cerr << "Calling GetInterfacePTPDiscrete(), should use GetInterfacePTPDiscreteShared() instead"
                          << std::endl;

            if(_m_PTPD)
                return _m_PTPD;
            else
                return _m_PTPDshared.get();
        }